

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# resp_msg.hxx
# Opt level: O0

void __thiscall nuraft::resp_msg::~resp_msg(resp_msg *this)

{
  msg_base *in_RDI;
  
  in_RDI->_vptr_msg_base = (_func_int **)&PTR__resp_msg_002512d8;
  std::
  function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
  ::~function((function<std::shared_ptr<nuraft::cmd_result<std::shared_ptr<nuraft::buffer>,_std::shared_ptr<std::exception>_>_>_()>
               *)0x17de7a);
  std::function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)>::~function
            ((function<std::shared_ptr<nuraft::resp_msg>_(std::shared_ptr<nuraft::resp_msg>)> *)
             0x17de88);
  std::shared_ptr<nuraft::peer>::~shared_ptr((shared_ptr<nuraft::peer> *)0x17de96);
  std::shared_ptr<nuraft::buffer>::~shared_ptr((shared_ptr<nuraft::buffer> *)0x17dea4);
  msg_base::~msg_base(in_RDI);
  return;
}

Assistant:

resp_msg(ulong term,
             msg_type type,
             int32 src,
             int32 dst,
             ulong next_idx = 0L,
             bool accepted = false)
        : msg_base(term, type, src, dst)
        , next_idx_(next_idx)
        , next_batch_size_hint_in_bytes_(0)
        , accepted_(accepted)
        , ctx_(nullptr)
        , cb_func_(nullptr)
        , async_cb_func_(nullptr)
        , result_code_(cmd_result_code::OK)
        {}